

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall flatbuffers::Parser::ParseService(Parser *this,char *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  char cVar3;
  StructDef *pSVar4;
  bool bVar5;
  ServiceDef *e;
  RPCCall *e_00;
  char *in_RDX;
  CheckedError *ce;
  int t;
  Namespace *this_00;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  string rpc_name;
  string service_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  doc_comment;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  service_comment;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  string local_b8;
  StructDef *local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  undefined8 local_58;
  undefined2 local_50;
  undefined6 uStack_4e;
  undefined2 uStack_48;
  undefined8 uStack_46;
  
  local_90 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(filename + 0x48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_70,local_90);
  Next(this);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,*(long *)(filename + 0x28),
               *(long *)(filename + 0x30) + *(long *)(filename + 0x28));
    t = (int)filename;
    Expect(this,t);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      e = (ServiceDef *)operator_new(0x110);
      paVar1 = &(e->super_Definition).name.field_2;
      memset(paVar1,0,0xd0);
      (e->super_Definition).name._M_dataplus._M_p = (pointer)paVar1;
      (e->super_Definition).name._M_string_length = 0;
      (e->super_Definition).file._M_dataplus._M_p = (pointer)&(e->super_Definition).file.field_2;
      (e->super_Definition).file.field_2._M_local_buf[0] = '\0';
      (e->super_Definition).doc_comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (e->super_Definition).doc_comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (e->super_Definition).doc_comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p_Var2 = &(e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header;
      *(_Base_ptr *)
       ((long)&(e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header +
       8) = (_Base_ptr)0x0;
      *(_Rb_tree_header **)
       ((long)&(e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header +
       0x10) = p_Var2;
      *(_Rb_tree_header **)
       ((long)&(e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header +
       0x18) = p_Var2;
      (e->super_Definition).serialized_location = 0;
      (e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      (e->super_Definition).attributes.vec.
      super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (e->super_Definition).attributes.vec.
      super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (e->super_Definition).attributes.vec.
      super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (e->super_Definition).generated = false;
      (e->super_Definition).index = -1;
      (e->super_Definition).refcount = 1;
      p_Var2 = &(e->calls).dict._M_t._M_impl.super__Rb_tree_header;
      (e->calls).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (e->calls).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      (e->calls).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      (e->calls).dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      (e->calls).vec.
      super__Vector_base<flatbuffers::RPCCall_*,_std::allocator<flatbuffers::RPCCall_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (e->calls).vec.
      super__Vector_base<flatbuffers::RPCCall_*,_std::allocator<flatbuffers::RPCCall_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (e->calls).vec.
      super__Vector_base<flatbuffers::RPCCall_*,_std::allocator<flatbuffers::RPCCall_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::_M_assign((string *)e);
      std::__cxx11::string::_M_assign((string *)&(e->super_Definition).file);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&(e->super_Definition).doc_comment,&local_70);
      this_00 = *(Namespace **)(filename + 0x198);
      (e->super_Definition).defined_namespace = this_00;
      if ((in_RDX != (char *)0x0) && (*(long *)(filename + 0x628) != 0)) {
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        strlen(in_RDX);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8);
        FilePath(&local_118,(string *)(filename + 0x620),&local_d8,(bool)filename[0x4e4]);
        pVar6 = std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)(filename + 0x748),&local_118);
        (e->super_Definition).declaration_file = (string *)(pVar6.first._M_node._M_node + 1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,
                          CONCAT62(local_d8.field_2._M_allocated_capacity._2_6_,
                                   local_d8.field_2._M_allocated_capacity._0_2_) + 1);
        }
        this_00 = *(Namespace **)(filename + 0x198);
      }
      Namespace::GetFullyQualifiedName(&local_118,this_00,&local_b8,1000);
      bVar5 = SymbolTable<flatbuffers::ServiceDef>::Add
                        ((SymbolTable<flatbuffers::ServiceDef> *)(filename + 0x138),&local_118,e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if (bVar5) {
        std::operator+(&local_118,"service already exists: ",&local_b8);
        Error(this,(string *)filename);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        ParseMetaData(this,(SymbolTable<flatbuffers::Value> *)filename);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          Expect(this,t);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            do {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_88,local_90);
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_118,*(long *)(filename + 0x28),
                         *(long *)(filename + 0x30) + *(long *)(filename + 0x28));
              Expect(this,t);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') {
LAB_00118dae:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != &local_118.field_2) {
                  operator_delete(local_118._M_dataplus._M_p,
                                  local_118.field_2._M_allocated_capacity + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_88);
                goto LAB_00118dd6;
              }
              Expect(this,t);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00118dae;
              local_d8.field_2._M_allocated_capacity._0_2_ = 0;
              local_d8.field_2._M_allocated_capacity._2_6_ = 0;
              local_d8.field_2._8_2_ = 0;
              local_d8._M_dataplus._M_p = (pointer)0x0;
              local_d8._M_string_length._0_2_ = 0;
              local_d8._M_string_length._2_6_ = 0;
              uStack_48 = 0;
              uStack_46 = 0;
              local_58 = 0;
              local_50 = 0;
              uStack_4e = 0;
              ParseTypeIdent(this,(Type *)filename);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00118dae;
              Expect(this,t);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00118dae;
              Expect(this,t);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00118dae;
              ParseTypeIdent(this,(Type *)filename);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00118dae;
              if (((((int)local_d8._M_dataplus._M_p != 0xf) ||
                   (((StructDef *)
                    CONCAT62(local_d8._M_string_length._2_6_,(undefined2)local_d8._M_string_length))
                    ->fixed != false)) || ((int)local_58 != 0xf)) ||
                 (pSVar4 = (StructDef *)CONCAT62(uStack_4e,local_50), pSVar4->fixed == true)) {
                local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_f8,"rpc request and response types must be tables","");
                Error(this,(string *)filename);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_00118da1:
                  operator_delete(local_f8._M_dataplus._M_p,
                                  local_f8.field_2._M_allocated_capacity + 1);
                }
                goto LAB_00118dae;
              }
              local_98 = (StructDef *)
                         CONCAT62(local_d8._M_string_length._2_6_,
                                  (undefined2)local_d8._M_string_length);
              e_00 = (RPCCall *)operator_new(0xd8);
              paVar1 = &(e_00->super_Definition).name.field_2;
              memset(paVar1,0,200);
              (e_00->super_Definition).name._M_dataplus._M_p = (pointer)paVar1;
              (e_00->super_Definition).name._M_string_length = 0;
              (e_00->super_Definition).file._M_dataplus._M_p =
                   (pointer)&(e_00->super_Definition).file.field_2;
              (e_00->super_Definition).file.field_2._M_local_buf[0] = '\0';
              (e_00->super_Definition).doc_comment.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (e_00->super_Definition).doc_comment.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (e_00->super_Definition).doc_comment.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              p_Var2 = &(e_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header;
              *(_Base_ptr *)
               ((long)&(e_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header.
                       _M_header + 8) = (_Base_ptr)0x0;
              *(_Rb_tree_header **)
               ((long)&(e_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header.
                       _M_header + 0x10) = p_Var2;
              *(_Rb_tree_header **)
               ((long)&(e_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header.
                       _M_header + 0x18) = p_Var2;
              (e_00->super_Definition).serialized_location = 0;
              (e_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header.
              _M_node_count = 0;
              (e_00->super_Definition).attributes.vec.
              super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (e_00->super_Definition).attributes.vec.
              super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (e_00->super_Definition).attributes.vec.
              super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (e_00->super_Definition).generated = false;
              (e_00->super_Definition).index = -1;
              (e_00->super_Definition).refcount = 1;
              std::__cxx11::string::_M_assign((string *)e_00);
              e_00->request = local_98;
              e_00->response = pSVar4;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator=(&(e_00->super_Definition).doc_comment,&local_88);
              bVar5 = SymbolTable<flatbuffers::RPCCall>::Add(&e->calls,&local_118,e_00);
              if (bVar5) {
                std::operator+(&local_f8,"rpc already exists: ",&local_118);
                Error(this,(string *)filename);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p != &local_f8.field_2) goto LAB_00118da1;
                goto LAB_00118dae;
              }
              ParseMetaData(this,(SymbolTable<flatbuffers::Value> *)filename);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00118dae;
              Expect(this,t);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              cVar3 = *(char *)&(this->super_ParserState).prev_cursor_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_88);
              if (cVar3 != '\0') goto LAB_00118dd6;
            } while (*(int *)(filename + 0x1c) != 0x7d);
            Next(this);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
              *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
            }
          }
        }
      }
    }
LAB_00118dd6:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseService(const char *filename) {
  std::vector<std::string> service_comment = doc_comment_;
  NEXT();
  auto service_name = attribute_;
  EXPECT(kTokenIdentifier);
  auto &service_def = *new ServiceDef();
  service_def.name = service_name;
  service_def.file = file_being_parsed_;
  service_def.doc_comment = service_comment;
  service_def.defined_namespace = current_namespace_;
  if (filename != nullptr && !opts.project_root.empty()) {
    service_def.declaration_file =
        &GetPooledString(FilePath(opts.project_root, filename, opts.binary_schema_absolute_paths));
  }
  if (services_.Add(current_namespace_->GetFullyQualifiedName(service_name),
                    &service_def))
    return Error("service already exists: " + service_name);
  ECHECK(ParseMetaData(&service_def.attributes));
  EXPECT('{');
  do {
    std::vector<std::string> doc_comment = doc_comment_;
    auto rpc_name = attribute_;
    EXPECT(kTokenIdentifier);
    EXPECT('(');
    Type reqtype, resptype;
    ECHECK(ParseTypeIdent(reqtype));
    EXPECT(')');
    EXPECT(':');
    ECHECK(ParseTypeIdent(resptype));
    if (reqtype.base_type != BASE_TYPE_STRUCT || reqtype.struct_def->fixed ||
        resptype.base_type != BASE_TYPE_STRUCT || resptype.struct_def->fixed)
      return Error("rpc request and response types must be tables");
    auto &rpc = *new RPCCall();
    rpc.name = rpc_name;
    rpc.request = reqtype.struct_def;
    rpc.response = resptype.struct_def;
    rpc.doc_comment = doc_comment;
    if (service_def.calls.Add(rpc_name, &rpc))
      return Error("rpc already exists: " + rpc_name);
    ECHECK(ParseMetaData(&rpc.attributes));
    EXPECT(';');
  } while (token_ != '}');
  NEXT();
  return NoError();
}